

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

uint32_t lua_hashstring(lua_State *L,int idx)

{
  uint32_t uVar1;
  TValue *pTVar2;
  ulong uVar3;
  
  pTVar2 = index2adr(L,idx);
  uVar3 = (ulong)(pTVar2->u32).lo;
  if (0xbf < *(byte *)(uVar3 + 7)) {
    uVar1 = lua_hash((char *)(uVar3 + 0x10),*(uint32_t *)(uVar3 + 0xc));
    return uVar1;
  }
  return *(uint32_t *)(uVar3 + 8);
}

Assistant:

LUA_API uint32_t lua_hashstring(lua_State *L, int idx)
{
  TValue *o = index2adr(L, idx);
  lj_checkapi(tvisstr(o), "stack slot %d is not a string", idx);
  GCstr *s = strV(o);
  if (! strsmart(s))
    return s->hash;
  return lua_hash(strdata(s), s->len);
}